

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_geom_topo(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_GEOM ref_geom;
  uint uVar1;
  undefined8 in_RAX;
  undefined8 uVar2;
  char *pcVar3;
  REF_BOOL node1_has_jump;
  REF_BOOL node0_has_jump;
  undefined8 local_28;
  
  ref_geom = ref_grid->geom;
  *allowed = 0;
  local_28 = in_RAX;
  uVar1 = ref_geom_has_jump(ref_geom,node0,(REF_BOOL *)((long)&local_28 + 4));
  if (uVar1 == 0) {
    uVar1 = ref_geom_has_jump(ref_geom,node1,(REF_BOOL *)&local_28);
    if (uVar1 == 0) {
      *allowed = (uint)((int)local_28 == 0 && local_28._4_4_ == 0);
      return 0;
    }
    pcVar3 = "n1 jump";
    uVar2 = 0x1d2;
  }
  else {
    pcVar3 = "n0 jump";
    uVar2 = 0x1d1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar2,
         "ref_swap_geom_topo",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_swap_geom_topo(REF_GRID ref_grid, REF_INT node0,
                                      REF_INT node1, REF_BOOL *allowed) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_BOOL node0_has_jump, node1_has_jump;

  *allowed = REF_FALSE;

  RSS(ref_geom_has_jump(ref_geom, node0, &node0_has_jump), "n0 jump");
  RSS(ref_geom_has_jump(ref_geom, node1, &node1_has_jump), "n1 jump");

  *allowed = !node0_has_jump && !node1_has_jump;

  return REF_SUCCESS;
}